

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O3

void __thiscall
DTSStreamReader::checkIfOnlyHDDataExists(DTSStreamReader *this,uint8_t *buff,uint8_t *end)

{
  uint32_t uVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  BitStreamReader reader;
  BitStreamReader local_50;
  
  if (buff < end + -4) {
    bVar2 = 1;
    do {
      uVar1 = *(uint32_t *)buff;
      uVar4 = my_ntohl(0x64582025);
      if (uVar1 != uVar4) {
        return;
      }
      local_50.super_BitStream.m_totalBits = 0;
      local_50.super_BitStream.m_buffer = (uint *)0x0;
      local_50.super_BitStream.m_initBuffer = (uint *)0x0;
      local_50.m_curVal = 0;
      local_50.m_bitLeft = 0;
      BitStream::setBuffer(&local_50.super_BitStream,(uint8_t *)((long)buff + 5),end);
      local_50._24_8_ = local_50._24_8_ & 0xffffffff;
      local_50.m_curVal = BitStreamReader::getCurVal(&local_50,local_50.super_BitStream.m_buffer);
      local_50.m_bitLeft = 0x20;
      BitStreamReader::skipBits(&local_50,2);
      bVar3 = BitStreamReader::getBit(&local_50);
      if (bVar3) {
        BitStreamReader::skipBits(&local_50,0xc);
        uVar5 = BitStreamReader::getBits(&local_50,0x14);
      }
      else {
        BitStreamReader::skipBits(&local_50,8);
        uVar5 = BitStreamReader::getBits(&local_50,0x10);
        uVar5 = uVar5 & 0xffff;
      }
      buff = (uint8_t *)((long)buff + (long)(int)(uVar5 + 1));
      bVar3 = (bool)(bVar2 & buff < end + -4);
      bVar2 = 0;
    } while (bVar3);
  }
  this->m_isCoreExists = false;
  return;
}

Assistant:

void DTSStreamReader::checkIfOnlyHDDataExists(uint8_t* buff, const uint8_t* end)
{
    for (int i = 0; i < 2 && buff < end - 4; ++i)
    {
        const bool isHDData = *reinterpret_cast<uint32_t*>(buff) == my_htonl(DTS_HD_PREFIX);
        if (!isHDData)
            return;

        BitStreamReader reader{};
        reader.setBuffer(buff + 5, end);  // skip 4 byte magic and 1 unknown byte
        int hdFrameSize;
        reader.skipBits(2);  // nuSubStreamIndex
        if (reader.getBit())
        {
            reader.skipBits(12);  // headerSize
            hdFrameSize = reader.getBits<int32_t>(20) + 1;
        }
        else
        {
            reader.skipBits(8);  // headerSize
            hdFrameSize = reader.getBits<uint16_t>(16) + 1;
        }
        buff += hdFrameSize;
    }
    m_isCoreExists = false;
}